

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O0

uc_err reg_read_arm(void *_env,int mode,uint regid,void *value,size_t *size)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t reg_value;
  uint32_t reg_index_2;
  uint32_t reg_index_1;
  uint32_t reg_index;
  uc_err ret;
  CPUARMState *env;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  reg_index_1 = 0xf;
  if ((regid < 0x42) || (0x4e < regid)) {
    if ((regid < 0x32) || (0x41 < regid)) {
      if ((regid < 0xe) || (0x2d < regid)) {
        if ((regid < 0x4f) || (0x6e < regid)) {
          switch(regid) {
          case 1:
            iVar3 = arm_feature((CPUARMState *)_env,9);
            if (iVar3 == 0) {
              if (*size < 4) {
                return UC_ERR_OVERFLOW;
              }
              *size = 4;
              uVar4 = cpsr_read_arm((CPUARMState *)_env);
              *(uint32_t *)value = uVar4 & 0xf80f0000;
            }
            else {
              if (*size < 4) {
                return UC_ERR_OVERFLOW;
              }
              *size = 4;
              uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,0);
              *(uint32_t *)value = uVar4;
            }
            reg_index_1 = 0;
            break;
          case 2:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = cpsr_read_arm((CPUARMState *)_env);
            *(uint32_t *)value = uVar4 & 0xf0000000;
            break;
          case 3:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = cpsr_read_arm((CPUARMState *)_env);
            *(uint32_t *)value = uVar4;
            break;
          case 4:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)value = *(undefined4 *)((long)_env + 0xe48);
            break;
          case 6:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = vfp_get_fpscr_arm((CPUARMState *)_env);
            *(uint32_t *)value = uVar4;
            break;
          case 8:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)value = *(undefined4 *)((long)_env + 0xe28);
            break;
          case 10:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)value = *(undefined4 *)((long)_env + 0x38);
            break;
          case 0xb:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)value = *(undefined4 *)((long)_env + 0x3c);
            break;
          case 0xc:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)value = *(undefined4 *)((long)_env + 0x34);
            break;
          case 0xd:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)value = *(undefined4 *)((long)_env + 0x158);
            break;
          case 0x6f:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(int *)value = (int)*(undefined8 *)((long)_env + 0x2c0);
            break;
          case 0x71:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(int *)value = (int)*(undefined8 *)((long)_env + 0x548);
            break;
          case 0x72:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,5);
            *(uint32_t *)value = uVar4;
            break;
          case 0x73:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,8);
            *(uint32_t *)value = uVar4;
            break;
          case 0x74:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,9);
            *(uint32_t *)value = uVar4;
            break;
          case 0x75:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,0x14);
            *(uint32_t *)value = uVar4;
            break;
          case 0x76:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,1);
            *(uint32_t *)value = uVar4;
            break;
          case 0x77:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,2);
            *(uint32_t *)value = uVar4;
            break;
          case 0x78:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,3);
            *(uint32_t *)value = uVar4;
            break;
          case 0x79:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,6);
            *(uint32_t *)value = uVar4;
            break;
          case 0x7a:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,7);
            *(uint32_t *)value = uVar4;
            break;
          case 0x7b:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,0x10);
            *(uint32_t *)value = uVar4;
            break;
          case 0x7c:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,0x11);
            *(uint32_t *)value = uVar4;
            break;
          case 0x7d:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,0x12);
            *(uint32_t *)value = uVar4;
            break;
          case 0x7e:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,0x13);
            *(uint32_t *)value = uVar4;
            break;
          case 0x8b:
            if (*size < 0x28) {
              return UC_ERR_OVERFLOW;
            }
            *size = 0x28;
            reg_index_1 = read_cp_reg((CPUARMState *)_env,(uc_arm_cp_reg *)value);
          }
        }
        else {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          reg_index_1 = 0;
          uVar2 = regid - 0x4f;
          uVar1 = *(undefined8 *)
                   ((long)_env + (ulong)((uVar2 & 3) >> 1) * 8 + (ulong)(uVar2 >> 2) * 0x10 + 0xc10)
          ;
          if ((uVar2 & 1) == 0) {
            *(int *)value = (int)uVar1;
          }
          else {
            *(int *)value = (int)((ulong)uVar1 >> 0x20);
          }
        }
      }
      else {
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        reg_index_1 = 0;
        *(undefined8 *)value =
             *(undefined8 *)
              ((long)_env + (ulong)(regid - 0xe & 1) * 8 + (ulong)(regid - 0xe >> 1) * 0x10 + 0xc10)
        ;
      }
    }
    else {
      if (*size < 0x10) {
        return UC_ERR_OVERFLOW;
      }
      *size = 0x10;
      reg_index_1 = 0;
      *(undefined8 *)value = *(undefined8 *)((long)_env + (ulong)(regid - 0x32) * 0x10 + 0xc10);
      *(undefined8 *)((long)value + 8) =
           *(undefined8 *)((long)_env + (ulong)(regid - 0x32) * 0x10 + 0xc18);
    }
  }
  else {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    reg_index_1 = 0;
    *(undefined4 *)value = *(undefined4 *)((long)_env + (ulong)(regid - 0x42) * 4);
  }
  return reg_index_1;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM_REG_R0 && regid <= UC_ARM_REG_R12) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = env->regs[regid - UC_ARM_REG_R0];
    } else if (regid >= UC_ARM_REG_Q0 && regid <= UC_ARM_REG_Q15) {
        CHECK_REG_TYPE(uint64_t[2]);
        uint32_t reg_index = regid - UC_ARM_REG_Q0;
        *(uint64_t *)value = env->vfp.zregs[reg_index].d[0];
        *(((uint64_t *)value) + 1) = env->vfp.zregs[reg_index].d[1];
    } else if (regid >= UC_ARM_REG_D0 && regid <= UC_ARM_REG_D31) {
        CHECK_REG_TYPE(uint64_t);
        uint32_t reg_index = regid - UC_ARM_REG_D0;
        *(uint64_t *)value = env->vfp.zregs[reg_index / 2].d[reg_index & 1];
    } else if (regid >= UC_ARM_REG_S0 && regid <= UC_ARM_REG_S31) {
        CHECK_REG_TYPE(uint32_t);
        uint32_t reg_index = regid - UC_ARM_REG_S0;
        uint64_t reg_value = env->vfp.zregs[reg_index / 4].d[reg_index % 4 / 2];

        if (reg_index % 2 == 0) {
            *(uint32_t *)value = (uint32_t)(reg_value & 0xffffffff);
        } else {
            *(uint32_t *)value = (uint32_t)(reg_value >> 32);
        }
    } else {
        switch (regid) {
        case UC_ARM_REG_APSR:
            if (arm_feature(env, ARM_FEATURE_M)) {
                CHECK_REG_TYPE(int32_t);
                *(int32_t *)value = v7m_mrs_xpsr(env, 0);
            } else {
                CHECK_REG_TYPE(int32_t);
                *(int32_t *)value =
                    cpsr_read(env) & (CPSR_NZCV | CPSR_Q | CPSR_GE);
            }
            break;
        case UC_ARM_REG_APSR_NZCV:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = cpsr_read(env) & CPSR_NZCV;
            break;
        case UC_ARM_REG_CPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = cpsr_read(env);
            break;
        case UC_ARM_REG_SPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->spsr;
            break;
        // case UC_ARM_REG_SP:
        case UC_ARM_REG_R13:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->regs[13];
            break;
        // case UC_ARM_REG_LR:
        case UC_ARM_REG_R14:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->regs[14];
            break;
        // case UC_ARM_REG_PC:
        case UC_ARM_REG_R15:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->regs[15];
            break;
        case UC_ARM_REG_C1_C0_2:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->cp15.cpacr_el1;
            break;
        case UC_ARM_REG_C13_C0_3:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->cp15.tpidrro_el[0];
            break;
        case UC_ARM_REG_FPEXC:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->vfp.xregs[ARM_VFP_FPEXC];
            break;
        case UC_ARM_REG_FPSCR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = vfp_get_fpscr(env);
            break;
        case UC_ARM_REG_FPSID:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->vfp.xregs[ARM_VFP_FPSID];
            break;
        case UC_ARM_REG_IPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 5);
            break;
        case UC_ARM_REG_MSP:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 8);
            break;
        case UC_ARM_REG_PSP:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 9);
            break;
        case UC_ARM_REG_IAPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 1);
            break;
        case UC_ARM_REG_EAPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 2);
            break;
        case UC_ARM_REG_XPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 3);
            break;
        case UC_ARM_REG_EPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 6);
            break;
        case UC_ARM_REG_IEPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 7);
            break;
        case UC_ARM_REG_PRIMASK:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 16);
            break;
        case UC_ARM_REG_BASEPRI:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 17);
            break;
        case UC_ARM_REG_BASEPRI_MAX:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 18);
            break;
        case UC_ARM_REG_FAULTMASK:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 19);
            break;
        case UC_ARM_REG_CONTROL:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 20);
            break;
        case UC_ARM_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm_cp_reg);
            ret = read_cp_reg(env, (uc_arm_cp_reg *)value);
            break;
        }
    }

    return ret;
}